

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_packet.cc
# Opt level: O3

void __thiscall QuickPacket::QuickPacket(QuickPacket *this)

{
  uchar *puVar1;
  
  this->_sequence_number = 0;
  this->_packet_number = 0;
  (this->_data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->_data_len = 0;
  this->_acked = false;
  puVar1 = (uchar *)operator_new__(0x578);
  (this->_data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar1;
  return;
}

Assistant:

QuickPacket::QuickPacket()
{
	_data.reset(new uint8_t[MAX_PKT_LEN]);
}